

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbo_linecount.cpp
# Opt level: O0

int __thiscall TURBOLINECOUNT::CLineCount::open(CLineCount *this,char *__file,int __oflag,...)

{
  bool bVar1;
  allocator<char> local_41;
  tlc_string_t local_40;
  byte local_1d;
  tlc_filehandle_t local_1c;
  bool auto_close_local;
  CLineCount *pCStack_18;
  tlc_filehandle_t fhandle_local;
  CLineCount *this_local;
  
  local_1c = (tlc_filehandle_t)__file;
  local_1d = (byte)__oflag & 1;
  bVar1 = (this->m_opened & 1U) == 0;
  if (bVar1) {
    this->m_fh = local_1c;
    this->m_opened = true;
    this->m_auto_close = (bool)local_1d;
  }
  else {
    pCStack_18 = this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"file already opened",&local_41);
    setLastError(this,0x11,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    this = (CLineCount *)std::allocator<char>::~allocator(&local_41);
  }
  return (int)CONCAT71((int7)((ulong)this >> 8),bVar1);
}

Assistant:

bool CLineCount::open(tlc_filehandle_t fhandle, bool auto_close)
{
	if (m_opened)
	{
		setLastError(EEXIST, _T("file already opened"));
		return false;
	}

	m_fh = fhandle;
	m_opened = true;
	m_auto_close = auto_close;

	return true;
}